

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  cmListFileBacktrace *this;
  undefined8 this_00;
  long lVar1;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string comment;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string message;
  cmMessenger *messenger_local;
  string *value_local;
  string *key_local;
  ostream *fout_local;
  
  message.field_2._8_8_ = messenger;
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (message.field_2._8_8_ != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"Value of ",&local_49);
      std::allocator<char>::~allocator(&local_49);
      std::__cxx11::string::operator+=((string *)local_48,(string *)key);
      std::__cxx11::string::operator+=((string *)local_48," contained a newline; truncating");
      this_00 = message.field_2._8_8_;
      comment.field_2._8_8_ = 0;
      this = (cmListFileBacktrace *)((long)&comment.field_2 + 8);
      cmListFileBacktrace::cmListFileBacktrace(this);
      cmMessenger::IssueMessage((cmMessenger *)this_00,WARNING,(string *)local_48,this);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&comment.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)local_48);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"WARNING: Value of ",&local_99);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::operator+=((string *)local_98,(string *)key);
    std::__cxx11::string::operator+=
              ((string *)local_98," contained a newline and was truncated. Original value:");
    OutputWarningComment(fout,(string *)local_98,true);
    OutputWarningComment(fout,value,false);
    std::__cxx11::string::~string((string *)local_98);
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message = "Value of ";
      message += key;
      message += " contained a newline; truncating";
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment = "WARNING: Value of ";
    comment += key;
    comment += " contained a newline and was truncated. Original value:";

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}